

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ImplicitWeakMessage::_InternalSerialize
          (ImplicitWeakMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int size;
  void *data;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ImplicitWeakMessage *this_local;
  
  this_local = (ImplicitWeakMessage *)target;
  if (this->data_ != (string *)0x0) {
    data = (void *)std::__cxx11::string::data();
    size = std::__cxx11::string::size();
    this_local = (ImplicitWeakMessage *)io::EpsCopyOutputStream::WriteRaw(stream,data,size,target);
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* _InternalSerialize(
      uint8_t* target, io::EpsCopyOutputStream* stream) const PROTOBUF_FINAL {
    if (data_ == nullptr) {
      return target;
    }
    return stream->WriteRaw(data_->data(), static_cast<int>(data_->size()),
                            target);
  }